

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O3

bool __thiscall BaseIndex::BlockUntilSyncedToCurrentChain(BaseIndex *this)

{
  __int_type_conflict2 _Var1;
  CBlockIndex *pCVar2;
  string_view source_file;
  bool bVar3;
  int iVar4;
  CBlockIndex *pCVar5;
  Logger *pLVar6;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock14;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  _Var1 = (this->m_synced)._M_base._M_i;
  if ((_Var1 & 1U) != 0) {
    local_58._M_dataplus._M_p = (pointer)&cs_main;
    local_58._M_string_length = local_58._M_string_length & 0xffffffffffffff00;
    std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&local_58);
    pCVar2 = (this->m_chainstate->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_finish[-1];
    pCVar5 = CBlockIndex::GetAncestor((this->m_best_block_index)._M_b._M_p,pCVar2->nHeight);
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&local_58);
    if (pCVar5 != pCVar2) {
      pLVar6 = LogInstance();
      bVar3 = BCLog::Logger::Enabled(pLVar6);
      if (bVar3) {
        local_58._M_string_length = 0;
        local_58.field_2._M_local_buf[0] = '\0';
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        tinyformat::format<char[31],std::__cxx11::string>
                  (&local_78,(tinyformat *)"%s: %s is catching up on block notifications\n",
                   "BlockUntilSyncedToCurrentChain",(char (*) [31])&this->m_name,in_R8);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&local_58,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        pLVar6 = LogInstance();
        local_78._M_dataplus._M_p = (pointer)0x57;
        local_78._M_string_length = 0xf988b7;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/base.cpp"
        ;
        source_file._M_len = 0x57;
        str._M_str = local_58._M_dataplus._M_p;
        str._M_len = local_58._M_string_length;
        logging_function._M_str = "BlockUntilSyncedToCurrentChain";
        logging_function._M_len = 0x1e;
        BCLog::Logger::LogPrintStr(pLVar6,str,logging_function,source_file,0x187,ALL,Info);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,
                          CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                   local_58.field_2._M_local_buf[0]) + 1);
        }
      }
      iVar4 = (*((this->m_chain)._M_t.
                 super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>
                 .super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl)->_vptr_Chain[0x36]
              )();
      ValidationSignals::SyncWithValidationInterfaceQueue
                (*(ValidationSignals **)(CONCAT44(extraout_var,iVar4) + 0xe0));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)(_Var1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool BaseIndex::BlockUntilSyncedToCurrentChain() const
{
    AssertLockNotHeld(cs_main);

    if (!m_synced) {
        return false;
    }

    {
        // Skip the queue-draining stuff if we know we're caught up with
        // m_chain.Tip().
        LOCK(cs_main);
        const CBlockIndex* chain_tip = m_chainstate->m_chain.Tip();
        const CBlockIndex* best_block_index = m_best_block_index.load();
        if (best_block_index->GetAncestor(chain_tip->nHeight) == chain_tip) {
            return true;
        }
    }

    LogPrintf("%s: %s is catching up on block notifications\n", __func__, GetName());
    m_chain->context()->validation_signals->SyncWithValidationInterfaceQueue();
    return true;
}